

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall fuzzFailures_convFailures_Test::TestBody(fuzzFailures_convFailures_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint64_t uVar3;
  precise_unit pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  AssertHelper local_6f8;
  Message local_6f0 [6];
  exception *e_9;
  undefined8 local_6b8;
  allocator local_6a9;
  string local_6a8;
  undefined1 auStack_688 [8];
  TrueWithString gtest_msg_9;
  AssertHelper local_648;
  Message local_640 [6];
  exception *e_8;
  undefined8 local_608;
  allocator local_5f9;
  string local_5f8;
  undefined1 auStack_5d8 [8];
  TrueWithString gtest_msg_8;
  AssertHelper local_598;
  Message local_590 [6];
  exception *e_7;
  undefined8 local_558;
  allocator local_549;
  string local_548;
  undefined1 auStack_528 [8];
  TrueWithString gtest_msg_7;
  AssertHelper local_4e8;
  Message local_4e0 [6];
  exception *e_6;
  undefined8 local_4a8;
  allocator local_499;
  string local_498;
  undefined1 auStack_478 [8];
  TrueWithString gtest_msg_6;
  AssertHelper local_438;
  Message local_430 [6];
  exception *e_5;
  undefined8 local_3f8;
  allocator local_3e9;
  string local_3e8;
  undefined1 auStack_3c8 [8];
  TrueWithString gtest_msg_5;
  AssertHelper local_388;
  Message local_380 [6];
  exception *e_4;
  undefined8 local_348;
  allocator local_339;
  string local_338;
  undefined1 auStack_318 [8];
  TrueWithString gtest_msg_4;
  AssertHelper local_2d8;
  Message local_2d0 [6];
  exception *e_3;
  undefined8 local_298;
  allocator local_289;
  string local_288;
  undefined1 auStack_268 [8];
  TrueWithString gtest_msg_3;
  AssertHelper local_228;
  Message local_220 [6];
  exception *e_2;
  undefined8 local_1e8;
  allocator local_1d9;
  string local_1d8;
  undefined1 auStack_1b8 [8];
  TrueWithString gtest_msg_2;
  AssertHelper local_178;
  Message local_170 [6];
  exception *e_1;
  undefined8 local_138;
  allocator local_129;
  string local_128;
  undefined1 auStack_108 [8];
  TrueWithString gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  AssertHelper local_c0;
  Message local_b8 [6];
  exception *e;
  double local_80;
  undefined8 local_78;
  allocator local_69;
  string local_68;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  fuzzFailures_convFailures_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"+z264",&local_69);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_68,uVar3);
      local_78 = pVar4._8_8_;
      local_80 = pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  else {
    testing::Message::Message(local_b8);
    std::operator+(&local_e0,
                   "Expected: unit_from_string(\"+z264\") doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(local_b8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_108 = (undefined1  [8])0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_108);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_108);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"+4560",&local_129);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_128,uVar3);
      local_138 = pVar4._8_8_;
      e_1 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
  }
  else {
    testing::Message::Message(local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_2.value.field_2 + 8),
                   "Expected: unit_from_string(\"+4560\") doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_108)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)(gtest_msg_2.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_170);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_108);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  auStack_1b8 = (undefined1  [8])0x0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_1b8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_1b8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,"24250v",&local_1d9);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_1d8,uVar3);
      local_1e8 = pVar4._8_8_;
      e_2 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
  }
  else {
    testing::Message::Message(local_220);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_3.value.field_2 + 8),
                   "Expected: unit_from_string(\"24250v\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1b8
                  );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)(gtest_msg_3.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_220);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_1b8);
  gtest_msg_3.value._M_string_length = 0;
  gtest_msg_3.value.field_2._M_allocated_capacity = 0;
  auStack_268 = (undefined1  [8])0x0;
  gtest_msg_3.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_3.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_268);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_268);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,"8(",&local_289);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_288,uVar3);
      local_298 = pVar4._8_8_;
      e_3 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
    }
  }
  else {
    testing::Message::Message(local_2d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_4.value.field_2 + 8),
                   "Expected: unit_from_string(\"8(\") doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_268)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)(gtest_msg_4.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_2d0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_268);
  gtest_msg_4.value._M_string_length = 0;
  gtest_msg_4.value.field_2._M_allocated_capacity = 0;
  auStack_318 = (undefined1  [8])0x0;
  gtest_msg_4.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_4.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_318);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_318);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_338,"8{",&local_339);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_338,uVar3);
      local_348 = pVar4._8_8_;
      e_4 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
    }
  }
  else {
    testing::Message::Message(local_380);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_5.value.field_2 + 8),
                   "Expected: unit_from_string(\"8{\") doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_318)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)(gtest_msg_5.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_380);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_318);
  gtest_msg_5.value._M_string_length = 0;
  gtest_msg_5.value.field_2._M_allocated_capacity = 0;
  auStack_3c8 = (undefined1  [8])0x0;
  gtest_msg_5.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_5.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_3c8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_3c8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e8,"0^%",&local_3e9);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_3e8,uVar3);
      local_3f8 = pVar4._8_8_;
      e_5 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    }
  }
  else {
    testing::Message::Message(local_430);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_6.value.field_2 + 8),
                   "Expected: unit_from_string(\"0^%\") doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_3c8)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)(gtest_msg_6.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_430);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_3c8);
  gtest_msg_6.value._M_string_length = 0;
  gtest_msg_6.value.field_2._M_allocated_capacity = 0;
  auStack_478 = (undefined1  [8])0x0;
  gtest_msg_6.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_6.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_478);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_478);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_498,"10*1001",&local_499);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_498,uVar3);
      local_4a8 = pVar4._8_8_;
      e_6 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
    }
  }
  else {
    testing::Message::Message(local_4e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_7.value.field_2 + 8),
                   "Expected: unit_from_string(\"10*1001\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_478
                  );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e8,local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)(gtest_msg_7.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_4e0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_478);
  gtest_msg_7.value._M_string_length = 0;
  gtest_msg_7.value.field_2._M_allocated_capacity = 0;
  auStack_528 = (undefined1  [8])0x0;
  gtest_msg_7.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_7.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_528);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_528);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_548,"s)^(z().",&local_549);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_548,uVar3);
      local_558 = pVar4._8_8_;
      e_7 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator((allocator<char> *)&local_549);
    }
  }
  else {
    testing::Message::Message(local_590);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_8.value.field_2 + 8),
                   "Expected: unit_from_string(\"s)^(z().\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_528
                  );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)(gtest_msg_8.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_590);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_528);
  gtest_msg_8.value._M_string_length = 0;
  gtest_msg_8.value.field_2._M_allocated_capacity = 0;
  auStack_5d8 = (undefined1  [8])0x0;
  gtest_msg_8.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_8.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_5d8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_5d8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5f8,"--+10*+1+110 U",&local_5f9);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_5f8,uVar3);
      local_608 = pVar4._8_8_;
      e_8 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    }
  }
  else {
    testing::Message::Message(local_640);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_9.value.field_2 + 8),
                   "Expected: unit_from_string(\"--+10*+1+110 U\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5d8
                  );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)(gtest_msg_9.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_640);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_5d8);
  gtest_msg_9.value._M_string_length = 0;
  gtest_msg_9.value.field_2._M_allocated_capacity = 0;
  auStack_688 = (undefined1  [8])0x0;
  gtest_msg_9.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_9.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_688);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_688);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6a8,"EQXUN[{ [",&local_6a9);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string(&local_6a8,uVar3);
      local_6b8 = pVar4._8_8_;
      e_9 = (exception *)pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
    }
  }
  else {
    testing::Message::Message(local_6f0);
    std::operator+(&local_718,
                   "Expected: unit_from_string(\"EQXUN[{ [\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_688
                  );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6f8,local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    std::__cxx11::string::~string((string *)&local_718);
    testing::Message::~Message(local_6f0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_688);
  return;
}

Assistant:

TEST(fuzzFailures, convFailures)
{
    EXPECT_NO_THROW(unit_from_string("+z264"));
    EXPECT_NO_THROW(unit_from_string("+4560"));
    EXPECT_NO_THROW(unit_from_string("24250v"));
    EXPECT_NO_THROW(unit_from_string("8("));
    EXPECT_NO_THROW(unit_from_string("8{"));
    EXPECT_NO_THROW(unit_from_string("0^%"));
    EXPECT_NO_THROW(unit_from_string("10*1001"));
    EXPECT_NO_THROW(unit_from_string("s)^(z()."));
    EXPECT_NO_THROW(unit_from_string("--+10*+1+110 U"));
    EXPECT_NO_THROW(unit_from_string("EQXUN[{ ["));
}